

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O1

void mainchan_get_specials(mainchan *mc,add_special_fn_t add_special,void *ctx)

{
  (*add_special)(ctx,"Break",SS_BRK,0);
  (*add_special)(ctx,"SIGINT (Interrupt)",SS_SIGINT,0);
  (*add_special)(ctx,"SIGTERM (Terminate)",SS_SIGTERM,0);
  (*add_special)(ctx,"SIGKILL (Kill)",SS_SIGKILL,0);
  (*add_special)(ctx,"SIGQUIT (Quit)",SS_SIGQUIT,0);
  (*add_special)(ctx,"SIGHUP (Hangup)",SS_SIGHUP,0);
  (*add_special)(ctx,"More signals",SS_SUBMENU,0);
  (*add_special)(ctx,"SIGABRT",SS_SIGABRT,0);
  (*add_special)(ctx,"SIGALRM",SS_SIGALRM,0);
  (*add_special)(ctx,"SIGFPE",SS_SIGFPE,0);
  (*add_special)(ctx,"SIGILL",SS_SIGILL,0);
  (*add_special)(ctx,"SIGPIPE",SS_SIGPIPE,0);
  (*add_special)(ctx,"SIGSEGV",SS_SIGSEGV,0);
  (*add_special)(ctx,"SIGUSR1",SS_SIGUSR1,0);
  (*add_special)(ctx,"SIGUSR2",SS_SIGUSR2,0);
  (*add_special)(ctx,(char *)0x0,SS_EXITMENU,0);
  return;
}

Assistant:

void mainchan_get_specials(
    mainchan *mc, add_special_fn_t add_special, void *ctx)
{
    /* FIXME: this _does_ depend on whether these services are supported */

    add_special(ctx, "Break", SS_BRK, 0);

    #define SIGNAL_MAIN(name, desc) \
    add_special(ctx, "SIG" #name " (" desc ")", SS_SIG ## name, 0);
    #define SIGNAL_SUB(name)
    #include "signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB

    add_special(ctx, "More signals", SS_SUBMENU, 0);

    #define SIGNAL_MAIN(name, desc)
    #define SIGNAL_SUB(name) \
    add_special(ctx, "SIG" #name, SS_SIG ## name, 0);
    #include "signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB

    add_special(ctx, NULL, SS_EXITMENU, 0);
}